

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O3

void __thiscall QueryCompiler::~QueryCompiler(QueryCompiler *this)

{
  pointer ppFVar1;
  Function *pFVar2;
  pointer pcVar3;
  pointer ppVVar4;
  pointer ppQVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppFVar6;
  
  ppFVar1 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar6 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar6 != ppFVar1; ppFVar6 = ppFVar6 + 1
      ) {
    pFVar2 = *ppFVar6;
    if ((pFVar2 != (Function *)0x0) &&
       (pcVar3 = (pFVar2->_name)._M_dataplus._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar3 != &(pFVar2->_name).field_2)) {
      operator_delete(pcVar3);
    }
    operator_delete(pFVar2);
  }
  std::
  _Hashtable<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_viewCache)._M_h);
  std::
  _Hashtable<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_cache)._M_h);
  ppFVar6 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar6 != (pointer)0x0) {
    operator_delete(ppFVar6);
  }
  ppVVar4 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar4 != (pointer)0x0) {
    operator_delete(ppVVar4);
  }
  ppQVar5 = (this->_queryList).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppQVar5 != (pointer)0x0) {
    operator_delete(ppQVar5);
  }
  this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

QueryCompiler::~QueryCompiler()
{
    for (Function* f : _functionList)
        delete f;
}